

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

bool __thiscall HighsSymmetryDetection::determineNextToDistinguish(HighsSymmetryDetection *this)

{
  vector<int_*,_std::allocator<int_*>_> *this_00;
  pointer *pppiVar1;
  int iVar2;
  int iVar3;
  pointer pNVar4;
  pointer piVar5;
  iterator iVar6;
  pointer ppiVar7;
  pointer ppiVar8;
  pointer ppiVar9;
  bool bVar10;
  HighsInt HVar11;
  int *in_RAX;
  long lVar12;
  int *piVar13;
  pointer ppiVar14;
  int *piVar15;
  pointer ppiVar16;
  long lVar17;
  iterator i;
  int *piVar18;
  int *local_38;
  
  pNVar4 = (this->nodeStack).
           super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppiVar14 = (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppiVar14) {
    (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppiVar14;
  }
  this_00 = &this->distinguishCands;
  iVar2 = pNVar4[-1].targetCell;
  lVar12 = (long)iVar2;
  piVar5 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar13 = piVar5 + lVar12;
  iVar3 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12];
  lVar17 = (long)iVar3;
  if (pNVar4[-1].lastDistiguished == -1) {
    if ((iVar2 != iVar3) && (piVar15 = piVar13 + 1, piVar15 != piVar5 + lVar17)) {
      lVar12 = lVar17 * 4 + lVar12 * -4 + -4;
      piVar18 = piVar13;
      do {
        piVar13 = piVar15;
        if (*piVar18 <= *piVar15) {
          piVar13 = piVar18;
        }
        piVar15 = piVar15 + 1;
        lVar12 = lVar12 + -4;
        piVar18 = piVar13;
      } while (lVar12 != 0);
    }
    iVar6._M_current =
         (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_38 = piVar13;
      std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*>
                ((vector<int*,std::allocator<int*>> *)this_00,iVar6,&local_38);
    }
    else {
      *iVar6._M_current = piVar13;
      pppiVar1 = &(this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      *pppiVar1 = *pppiVar1 + 1;
    }
  }
  else {
    local_38 = in_RAX;
    if (this->firstPathDepth <
        (int)((ulong)((long)pNVar4 -
                     (long)(this->nodeStack).
                           super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      if (iVar2 != iVar3) {
        lVar12 = lVar17 * 4 + lVar12 * -4;
        do {
          if ((pNVar4[-1].lastDistiguished < *piVar13) &&
             (bVar10 = checkStoredAutomorphism(this,*piVar13), bVar10)) {
            iVar6._M_current =
                 (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_38 = piVar13;
            if (iVar6._M_current ==
                (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*>
                        ((vector<int*,std::allocator<int*>> *)this_00,iVar6,&local_38);
            }
            else {
              *iVar6._M_current = piVar13;
              pppiVar1 = &(this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppiVar1 = *pppiVar1 + 1;
            }
          }
          piVar13 = piVar13 + 1;
          lVar12 = lVar12 + -4;
        } while (lVar12 != 0);
      }
      ppiVar14 = (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppiVar7 = (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppiVar9 = ppiVar14;
      ppiVar8 = ppiVar14;
      if (ppiVar14 == ppiVar7) {
        return false;
      }
      while (ppiVar16 = ppiVar9, ppiVar8 = ppiVar8 + 1, ppiVar8 != ppiVar7) {
        ppiVar9 = ppiVar8;
        if (**ppiVar16 <= **ppiVar8) {
          ppiVar9 = ppiVar16;
        }
      }
    }
    else {
      if (iVar2 != iVar3) {
        lVar12 = lVar17 * 4 + lVar12 * -4;
        do {
          if ((pNVar4[-1].lastDistiguished < *piVar13) &&
             (HVar11 = getOrbit(this,*piVar13),
             (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[HVar11] == *piVar13)) {
            iVar6._M_current =
                 (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_38 = piVar13;
            if (iVar6._M_current ==
                (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*>
                        ((vector<int*,std::allocator<int*>> *)this_00,iVar6,&local_38);
            }
            else {
              *iVar6._M_current = piVar13;
              pppiVar1 = &(this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppiVar1 = *pppiVar1 + 1;
            }
          }
          piVar13 = piVar13 + 1;
          lVar12 = lVar12 + -4;
        } while (lVar12 != 0);
      }
      ppiVar14 = (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppiVar7 = (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppiVar9 = ppiVar14;
      ppiVar8 = ppiVar14;
      if (ppiVar14 == ppiVar7) {
        return false;
      }
      while (ppiVar16 = ppiVar9, ppiVar8 = ppiVar8 + 1, ppiVar8 != ppiVar7) {
        ppiVar9 = ppiVar8;
        if (**ppiVar16 <= **ppiVar8) {
          ppiVar9 = ppiVar16;
        }
      }
    }
    piVar13 = *ppiVar14;
    *ppiVar14 = *ppiVar16;
    *ppiVar16 = piVar13;
    std::vector<int_*,_std::allocator<int_*>_>::resize(this_00,1);
  }
  return true;
}

Assistant:

bool HighsSymmetryDetection::determineNextToDistinguish() {
  Node& currNode = nodeStack.back();
  distinguishCands.clear();
  std::vector<HighsInt>::iterator cellStart;
  std::vector<HighsInt>::iterator cellEnd;
  cellStart = currentPartition.begin() + currNode.targetCell;
  cellEnd =
      currentPartition.begin() + currentPartitionLinks[currNode.targetCell];

  if (currNode.lastDistiguished == -1) {
    auto nextDistinguishPos = std::min_element(cellStart, cellEnd);
    distinguishCands.push_back(&*nextDistinguishPos);
  } else if ((HighsInt)nodeStack.size() > firstPathDepth) {
    for (auto i = cellStart; i != cellEnd; ++i) {
      if (*i > currNode.lastDistiguished && checkStoredAutomorphism(*i))
        distinguishCands.push_back(&*i);
    }
    if (distinguishCands.empty()) return false;
    auto nextDistinguishPos =
        std::min_element(distinguishCands.begin(), distinguishCands.end(),
                         [](HighsInt* a, HighsInt* b) { return *a < *b; });
    std::swap(*distinguishCands.begin(), *nextDistinguishPos);
    distinguishCands.resize(1);
  } else {
    for (auto i = cellStart; i != cellEnd; ++i) {
      if (*i > currNode.lastDistiguished && vertexGroundSet[getOrbit(*i)] == *i)
        distinguishCands.push_back(&*i);
    }
    if (distinguishCands.empty()) return false;
    auto nextDistinguishPos =
        std::min_element(distinguishCands.begin(), distinguishCands.end(),
                         [](HighsInt* a, HighsInt* b) { return *a < *b; });
    std::swap(*distinguishCands.begin(), *nextDistinguishPos);
    distinguishCands.resize(1);
  }

  return true;
}